

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

void __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::initializeTableContents
          (ModuleRunnerBase<wasm::ModuleRunner> *this)

{
  Type *pTVar1;
  pointer puVar2;
  Table *pTVar3;
  ulong uVar4;
  long *plVar5;
  HeapType type;
  ModuleRunnerBase<wasm::ModuleRunner> *in_RCX;
  Address i;
  ModuleRunnerBase<wasm::ModuleRunner> *pMVar6;
  unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *table;
  pointer puVar7;
  bool bVar8;
  anon_class_16_2_4039898f visitor;
  undefined1 local_70 [8];
  Const zero;
  Literal null;
  
  puVar2 = (this->wasm->tables).
           super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pTVar1 = &zero.value.type;
  for (puVar7 = (this->wasm->tables).
                super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar7 != puVar2; puVar7 = puVar7 + 1) {
    pTVar3 = (puVar7->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
             _M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
             super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
    uVar4 = (pTVar3->type).id;
    bVar8 = ((uint)uVar4 & 3) != 2;
    in_RCX = (ModuleRunnerBase<wasm::ModuleRunner> *)(ulong)(bVar8 || uVar4 < 7);
    if (!bVar8 && uVar4 >= 7) {
      in_RCX = *(ModuleRunnerBase<wasm::ModuleRunner> **)
                ((long)&(pTVar3->super_Importable).super_Named + 8);
      getTableInstanceInfo
                ((TableInstanceInfo *)local_70,this,
                 (IString)*(IString *)&(pTVar3->super_Importable).super_Named);
      type = Type::getHeapType(&((puVar7->_M_t).
                                 super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>
                                 .super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->type);
      Literal::makeNull((Literal *)pTVar1,type);
      for (pMVar6 = (ModuleRunnerBase<wasm::ModuleRunner> *)0x0;
          pMVar6 < (ModuleRunnerBase<wasm::ModuleRunner> *)
                   (((puVar7->_M_t).
                     super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
                     super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                     super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->initial).addr;
          pMVar6 = (ModuleRunnerBase<wasm::ModuleRunner> *)
                   ((long)&(pMVar6->super_ExpressionRunner<wasm::ModuleRunner>).
                           _vptr_ExpressionRunner + 1)) {
        plVar5 = *(long **)(CONCAT71(local_70._1_7_,local_70[0]) + 0x200);
        in_RCX = pMVar6;
        (**(code **)(*plVar5 + 0xe0))
                  (plVar5,zero.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.
                          _0_8_,
                   zero.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type.id,
                   pMVar6,pTVar1);
      }
      ::wasm::Literal::~Literal((Literal *)pTVar1);
    }
  }
  pTVar1 = &zero.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type;
  local_70[0] = 0xe;
  zero.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._id = InvalidId;
  zero.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._1_7_ = 0;
  zero.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type.id = 0;
  zero.value.field_0.i64 = 0;
  zero.value.field_0.func.super_IString.str._M_str = (char *)0x0;
  zero.value.type.id._0_4_ = 0;
  ::wasm::Literal::operator=((Literal *)pTVar1,(Literal *)&zero.value.type);
  ::wasm::Literal::~Literal((Literal *)&zero.value.type);
  ::wasm::Const::finalize();
  visitor.this = in_RCX;
  visitor.zero = (Const *)this;
  ModuleUtils::
  iterActiveElementSegments<wasm::ModuleRunnerBase<wasm::ModuleRunner>::initializeTableContents()::_lambda(wasm::ElementSegment*)_1_>
            ((ModuleUtils *)this->wasm,(Module *)local_70,visitor);
  ::wasm::Literal::~Literal((Literal *)pTVar1);
  return;
}

Assistant:

void initializeTableContents() {
    for (auto& table : wasm.tables) {
      if (table->type.isNullable()) {
        // Initial with nulls in a nullable table.
        auto info = getTableInstanceInfo(table->name);
        auto null = Literal::makeNull(table->type.getHeapType());
        for (Address i = 0; i < table->initial; i++) {
          info.interface()->tableStore(info.name, i, null);
        }
      }
    }

    Const zero;
    zero.value = Literal(uint32_t(0));
    zero.finalize();

    ModuleUtils::iterActiveElementSegments(wasm, [&](ElementSegment* segment) {
      Const size;
      size.value = Literal(uint32_t(segment->data.size()));
      size.finalize();

      TableInit init;
      init.table = segment->table;
      init.segment = segment->name;
      init.dest = segment->offset;
      init.offset = &zero;
      init.size = &size;
      init.finalize();

      self()->visit(&init);

      droppedElementSegments.insert(segment->name);
    });
  }